

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3aa4::SingleEvaluationTest_WriteTests_Test::TestBody
          (SingleEvaluationTest_WriteTests_Test *this)

{
  bool bVar1;
  AssertionResult *pAVar2;
  char *pcVar3;
  string gtest_output;
  AssertionResult gtest_ar;
  string gtest_expected_output;
  AssertionResult gtest_ar_3;
  OutputRedirect gtest_redir_1;
  OutputRedirect gtest_redir;
  TestPartResultArray gtest_failures;
  
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    (anonymous_namespace)::SingleEvaluationTest::b_ =
         (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
    std::__cxx11::string::string((string *)&gtest_expected_output,"test",(allocator *)&gtest_output)
    ;
    OutputRedirect::OutputRedirect(&gtest_redir,_stdout);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (anonymous_namespace)::SingleEvaluationTest::a_ =
           (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
      printf("test");
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&gtest_output,&gtest_redir);
    bVar1 = std::operator!=(&gtest_output,&gtest_expected_output);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&gtest_output);
      OutputRedirect::~OutputRedirect(&gtest_redir);
      std::__cxx11::string::~string((string *)&gtest_expected_output);
      goto LAB_0010e552;
    }
    pAVar2 = testing::AssertionResult::operator<<
                       (&gtest_ar,
                        (char (*) [59])
                        "{ a_++; std::printf(\"test\"); } produces different output.\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483f5);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&gtest_expected_output);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x148ae2);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483e9);
    testing::AssertionResult::operator<<(pAVar2,&gtest_output);
    std::__cxx11::string::~string((string *)&gtest_output);
    OutputRedirect::~OutputRedirect(&gtest_redir);
    std::__cxx11::string::~string((string *)&gtest_expected_output);
  }
  testing::Message::Message((Message *)&gtest_expected_output);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_output,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0xa1,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_output,(Message *)&gtest_expected_output);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_output);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_output);
LAB_0010e552:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_output._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_output,"1","a_",(int *)&gtest_output,
             &(anonymous_namespace)::SingleEvaluationTest::a_);
  if ((char)gtest_expected_output._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_output);
    if (gtest_expected_output._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_expected_output._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_output._M_string_length);
  gtest_output._M_dataplus._M_p._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_expected_output,"1","b_",(int *)&gtest_output,
             &(anonymous_namespace)::SingleEvaluationTest::b_);
  if ((char)gtest_expected_output._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_output);
    if (gtest_expected_output._M_string_length == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_expected_output._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_output);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_output);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_expected_output._M_string_length);
  do {
    gtest_failures.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    gtest_failures.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    gtest_failures.array_.
    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&gtest_output,"Actual: test",(allocator *)&gtest_ar);
    testing::internal::SingleFailureChecker::SingleFailureChecker
              ((SingleFailureChecker *)&gtest_expected_output,&gtest_failures,kNonFatalFailure,
               &gtest_output);
    std::__cxx11::string::~string((string *)&gtest_output);
    testing::ScopedFakeTestPartResultReporter::ScopedFakeTestPartResultReporter
              ((ScopedFakeTestPartResultReporter *)&gtest_output,INTERCEPT_ONLY_CURRENT_THREAD,
               &gtest_failures);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::AssertionSuccess();
      if (gtest_ar_3.success_ == true) {
        (anonymous_namespace)::SingleEvaluationTest::b_ =
             (anonymous_namespace)::SingleEvaluationTest::b_ + 1;
        std::__cxx11::string::string((string *)&gtest_ar,"other",(allocator *)&gtest_redir);
        OutputRedirect::OutputRedirect(&gtest_redir_1,_stdout);
        bVar1 = testing::internal::AlwaysTrue();
        if (bVar1) {
          (anonymous_namespace)::SingleEvaluationTest::a_ =
               (anonymous_namespace)::SingleEvaluationTest::a_ + 1;
          printf("test");
        }
        OutputRedirect::restore_and_read_abi_cxx11_((string *)&gtest_redir,&gtest_redir_1);
        bVar1 = std::operator!=((string *)&gtest_redir,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&gtest_ar);
        if (bVar1) {
          pAVar2 = testing::AssertionResult::operator<<
                             (&gtest_ar_3,
                              (char (*) [59])
                              "{ a_++; std::printf(\"test\"); } produces different output.\n");
          pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483f5);
          pAVar2 = testing::AssertionResult::operator<<
                             (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&gtest_ar);
          pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x148ae2);
          pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1483e9);
          testing::AssertionResult::operator<<(pAVar2,(string *)&gtest_redir);
          std::__cxx11::string::~string((string *)&gtest_redir);
          OutputRedirect::~OutputRedirect(&gtest_redir_1);
          std::__cxx11::string::~string((string *)&gtest_ar);
          goto LAB_0010e7e9;
        }
        std::__cxx11::string::~string((string *)&gtest_redir);
        OutputRedirect::~OutputRedirect(&gtest_redir_1);
        std::__cxx11::string::~string((string *)&gtest_ar);
      }
      else {
LAB_0010e7e9:
        testing::Message::Message((Message *)&gtest_ar);
        pcVar3 = "";
        if (gtest_ar_3.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_redir,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xa9,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_redir,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_redir);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_3.message_);
    }
    testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
              ((ScopedFakeTestPartResultReporter *)&gtest_output);
    testing::internal::SingleFailureChecker::~SingleFailureChecker
              ((SingleFailureChecker *)&gtest_expected_output);
    std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::~vector
              (&gtest_failures.array_);
    bVar1 = testing::internal::AlwaysFalse();
    if (!bVar1) {
      gtest_output._M_dataplus._M_p._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_expected_output,"2","a_",(int *)&gtest_output,
                 &(anonymous_namespace)::SingleEvaluationTest::a_);
      if ((char)gtest_expected_output._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&gtest_output);
        if (gtest_expected_output._M_string_length == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_expected_output._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xaa,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar,(Message *)&gtest_output);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_output);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_output._M_string_length);
      gtest_output._M_dataplus._M_p._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_expected_output,"2","b_",(int *)&gtest_output,
                 &(anonymous_namespace)::SingleEvaluationTest::b_);
      if ((char)gtest_expected_output._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&gtest_output);
        if (gtest_expected_output._M_string_length == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_expected_output._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
                   ,0xab,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar,(Message *)&gtest_output);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_output);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_output._M_string_length);
      return;
    }
  } while( true );
}

Assistant:

TEST_F(SingleEvaluationTest, WriteTests) {
  // successful EXPECT_WRITE
  EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "test"));
  EXPECT_EQ(1, a_);
  EXPECT_EQ(1, b_);

  // failed EXPECT_WRITE
  EXPECT_NONFATAL_FAILURE(EXPECT_WRITE(stdout, {  // NOLINT
    a_++;
    std::printf("test");
  }, (b_++, "other")), "Actual: test");
  EXPECT_EQ(2, a_);
  EXPECT_EQ(2, b_);
}